

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::builtins::PrintTimeScaleTask::bindArgument
          (PrintTimeScaleTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  Compilation *pCVar1;
  ExpressionSyntax *pEVar2;
  bool bVar3;
  Type *args_1;
  Compilation *compilation;
  bitmask<slang::ast::LookupFlags> extraLookupFlags;
  bitmask<slang::ast::LookupFlags> local_64;
  void *local_60;
  SourceRange local_58;
  DiagCode local_44;
  Compilation *local_40;
  Compilation *comp;
  Args *args_local;
  ExpressionSyntax *syntax_local;
  ASTContext *context_local;
  size_t argIndex_local;
  PrintTimeScaleTask *this_local;
  
  comp = (Compilation *)args;
  args_local = (Args *)syntax;
  syntax_local = (ExpressionSyntax *)context;
  context_local = (ASTContext *)argIndex;
  argIndex_local = (size_t)this;
  if (argIndex == 0) {
    local_40 = ASTContext::getCompilation(context);
    extraLookupFlags.m_bits = (underlying_type)args;
    bVar3 = slang::syntax::NameSyntax::isKind((SyntaxKind)args_local->size_);
    pEVar2 = syntax_local;
    pCVar1 = local_40;
    if (bVar3) {
      compilation = (Compilation *)
                    slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>
                              ((SyntaxNode *)args_local);
      pEVar2 = syntax_local;
      memset(&local_64,0,4);
      bitmask<slang::ast::LookupFlags>::bitmask(&local_64);
      this_local = (PrintTimeScaleTask *)
                   HierarchicalReferenceExpression::fromSyntax
                             ((HierarchicalReferenceExpression *)pCVar1,compilation,
                              (NameSyntax *)pEVar2,(ASTContext *)(ulong)local_64.m_bits,
                              extraLookupFlags);
    }
    else {
      local_44.subsystem = SysFuncs;
      local_44.code = 0xc;
      local_58 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)args_local);
      ASTContext::addDiag((ASTContext *)pEVar2,local_44,local_58);
      pCVar1 = local_40;
      local_60 = (void *)0x0;
      args_1 = Compilation::getErrorType(local_40);
      this_local = (PrintTimeScaleTask *)
                   BumpAllocator::
                   emplace<slang::ast::InvalidExpression,decltype(nullptr),slang::ast::Type_const&>
                             (&pCVar1->super_BumpAllocator,&local_60,args_1);
    }
  }
  else {
    this_local = (PrintTimeScaleTask *)
                 SystemSubroutine::bindArgument
                           ((SystemSubroutine *)this,argIndex,context,syntax,args);
  }
  return (Expression *)this_local;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if (argIndex == 0) {
            auto& comp = context.getCompilation();
            if (!NameSyntax::isKind(syntax.kind)) {
                context.addDiag(diag::ExpectedModuleName, syntax.sourceRange());
                return *comp.emplace<InvalidExpression>(nullptr, comp.getErrorType());
            }

            return HierarchicalReferenceExpression::fromSyntax(comp, syntax.as<NameSyntax>(),
                                                               context);
        }

        return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
    }